

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

void RandWalk(shared_ptr<MWakler> *walker)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  element_type *peVar5;
  Mrect r;
  Mrect r_1;
  int randY;
  int randX;
  vector<Mrect,_std::allocator<Mrect>_> *in_stack_ffffffffffffffd0;
  value_type *in_stack_ffffffffffffffd8;
  undefined8 uVar6;
  value_type *__x;
  vector<Mrect,_std::allocator<Mrect>_> *in_stack_ffffffffffffffe0;
  
  std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1315d2);
  bVar1 = std::vector<Mrect,_std::allocator<Mrect>_>::empty(in_stack_ffffffffffffffe0);
  if (bVar1) {
    iVar3 = rand();
    iVar2 = rand();
    Mrect::Mrect((Mrect *)&stack0xffffffffffffffe0,iVar3 % 100 + 10,iVar2 % 100 + 10,
                 iVar3 % 100 + 0x32,iVar2 % 100 + 0x32);
    std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x131637);
    std::vector<Mrect,_std::allocator<Mrect>_>::push_back
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  else {
    std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x131656);
    pvVar4 = std::vector<Mrect,_std::allocator<Mrect>_>::back(in_stack_ffffffffffffffd0);
    uVar6._0_4_ = pvVar4->x2;
    uVar6._4_4_ = pvVar4->y2;
    std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x13167c);
    peVar5 = std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x13169c);
    iVar3 = (int)((float)(int)uVar6 + (peVar5->mSpeed).sX);
    iVar2 = (int)((ulong)uVar6 >> 0x20);
    std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1316bc);
    peVar5 = std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x1316dc);
    __x = (value_type *)CONCAT44((int)((float)iVar2 + (peVar5->mSpeed).sY),iVar3);
    std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1316fc);
    std::vector<Mrect,_std::allocator<Mrect>_>::push_back(in_stack_ffffffffffffffe0,__x);
  }
  return;
}

Assistant:

inline void RandWalk(std::shared_ptr<MWakler> walker)
{
    if(walker->mRects.empty())
    {
        int randX = std::rand() % 100;
        int randY = std::rand() % 100;

        Mrect r{10 + randX,10 + randY,50 + randX,50 + randY};
        walker->mRects.push_back(r);
        return ;
    }

    Mrect r = walker->mRects.back();
    r.x1 += walker->mSpeed.sX;
    r.x2 += walker->mSpeed.sX;
    r.y1 += walker->mSpeed.sY;
    r.y2 += walker->mSpeed.sY;
    walker->mRects.push_back(r);
    return;
}